

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QConcatenable<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>_>::
  appendTo<QChar>(&p->a,out);
  QConcatenable<QString>::appendTo(p->b,out);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }